

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RevoluteJoint.cpp
# Opt level: O3

void __thiscall
iDynTree::RevoluteJoint::computeChildBiasAcc
          (RevoluteJoint *this,VectorDynSize *jntPos,VectorDynSize *jntVel,LinkVelArray *linkVels,
          LinkAccArray *linkBiasAccs,LinkIndex child,LinkIndex parent)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Twist *pTVar2;
  SpatialAcc *this_00;
  double dVar3;
  SpatialMotionVector vj;
  SpatialMotionVector S;
  Twist local_150 [48];
  Twist local_120 [48];
  Transform local_f0 [48];
  SpatialAcc local_c0;
  SpatialMotionVector local_90;
  undefined1 local_60 [48];
  
  iVar1 = (*(this->super_MovableJointImpl1).super_IJoint._vptr_IJoint[0x18])();
  dVar3 = (double)iDynTree::VectorDynSize::operator()(jntVel,CONCAT44(extraout_var,iVar1));
  iVar1 = (*(this->super_MovableJointImpl1).super_IJoint._vptr_IJoint[10])(this,jntPos,child,parent)
  ;
  (*(this->super_MovableJointImpl1).super_IJoint._vptr_IJoint[10])(this,jntPos,parent,child);
  (*(this->super_MovableJointImpl1).super_IJoint._vptr_IJoint[0xc])
            (local_60,this,0,child,LINK_INVALID_INDEX);
  iDynTree::SpatialMotionVector::operator*(&local_90,dVar3);
  LinkAccArray::operator()(linkBiasAccs,parent);
  iDynTree::Transform::operator*(local_f0,(SpatialAcc *)CONCAT44(extraout_var_00,iVar1));
  pTVar2 = LinkVelArray::operator()(linkVels,child);
  iDynTree::Twist::Twist(local_150,&local_90);
  iDynTree::Twist::operator*(local_120,pTVar2);
  iDynTree::SpatialAcc::operator+(&local_c0,(SpatialAcc *)local_f0);
  this_00 = LinkAccArray::operator()(linkBiasAccs,child);
  iDynTree::SpatialAcc::operator=(this_00,&local_c0);
  return;
}

Assistant:

void RevoluteJoint::computeChildBiasAcc(const VectorDynSize &jntPos,
                                        const VectorDynSize &jntVel,
                                        const LinkVelArray &linkVels,
                                              LinkAccArray &linkBiasAccs,
                                         const LinkIndex child, const LinkIndex parent) const
{
    double dang = jntVel(this->getDOFsOffset());
    const Transform & child_X_parent = this->getTransform(jntPos,child,parent);
    const Transform & parent_X_child = this->getTransform(jntPos,parent,child);
    iDynTree::SpatialMotionVector S = this->getMotionSubspaceVector(0,child);
    SpatialMotionVector vj = S*dang;
    linkBiasAccs(child) = child_X_parent*linkBiasAccs(parent) + linkVels(child)*vj;
}